

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grand.c
# Opt level: O3

void g_rand_set_seed_array(GRand *rand,guint32 *seed,guint seed_length)

{
  uint uVar1;
  guint gVar2;
  int iVar3;
  uint uVar4;
  
  g_rand_set_seed(rand,0x12bd6aa);
  gVar2 = 0x270;
  if (0x270 < seed_length) {
    gVar2 = seed_length;
  }
  uVar1 = 1;
  uVar4 = 0;
  do {
    rand->mt[uVar1] =
         seed[uVar4] + uVar4 +
         ((rand->mt[uVar1 - 1] >> 0x1e ^ rand->mt[uVar1 - 1]) * 0x19660d ^ rand->mt[uVar1]);
    if (uVar1 < 0x26f) {
      uVar1 = uVar1 + 1;
    }
    else {
      rand->mt[0] = rand->mt[0x26f];
      uVar1 = 1;
    }
    uVar4 = uVar4 + 1;
    if (seed_length <= uVar4) {
      uVar4 = 0;
    }
    gVar2 = gVar2 - 1;
  } while (gVar2 != 0);
  iVar3 = -0x26f;
  do {
    rand->mt[uVar1] =
         ((rand->mt[uVar1 - 1] >> 0x1e ^ rand->mt[uVar1 - 1]) * 0x5d588b65 ^ rand->mt[uVar1]) -
         uVar1;
    if (uVar1 < 0x26f) {
      uVar1 = uVar1 + 1;
    }
    else {
      rand->mt[0] = rand->mt[0x26f];
      uVar1 = 1;
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0);
  rand->mt[0] = 0x80000000;
  return;
}

Assistant:

void g_rand_set_seed_array (GRand *rand, const guint32 *seed, guint seed_length)
{
    guint i, j, k;

    g_return_if_fail (rand != NULL);
    g_return_if_fail (seed_length >= 1);

    g_rand_set_seed (rand, 19650218UL);

    i=1; j=0;
    k = (N>seed_length ? N : seed_length);
    for (; k; k--)
    {
        rand->mt[i] = (rand->mt[i] ^
                ((rand->mt[i-1] ^ (rand->mt[i-1] >> 30)) * 1664525UL))
            + seed[j] + j; /* non linear */
        rand->mt[i] &= 0xffffffffUL; /* for WORDSIZE > 32 machines */
        i++; j++;
        if (i>=N)
        {
            rand->mt[0] = rand->mt[N-1];
            i=1;
        }
        if (j>=seed_length)
            j=0;
    }
    for (k=N-1; k; k--)
    {
        rand->mt[i] = (rand->mt[i] ^
                ((rand->mt[i-1] ^ (rand->mt[i-1] >> 30)) * 1566083941UL))
            - i; /* non linear */
        rand->mt[i] &= 0xffffffffUL; /* for WORDSIZE > 32 machines */
        i++;
        if (i>=N)
        {
            rand->mt[0] = rand->mt[N-1];
            i=1;
        }
    }

    rand->mt[0] = 0x80000000UL; /* MSB is 1; assuring non-zero initial array */ 
}